

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeReduceLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  ShapeConstraint *pSVar1;
  ReduceLayerParams_ReduceAxis RVar2;
  string *psVar3;
  mapped_type *pmVar4;
  ShapeRange *pSVar5;
  ShapeRange *pSVar6;
  ReduceLayerParams *from;
  runtime_error *this_00;
  ShapeRange local_178;
  ShapeRange local_158;
  ShapeRange local_138;
  ShapeRange local_118;
  ShapeRange local_f8;
  ShapeRange local_d8;
  ShapeRange local_b8;
  undefined1 local_88 [8];
  ReduceLayerParams reduce;
  ShapeRange local_48;
  mapped_type *local_28;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  local_28 = pmVar4;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(pmVar4,psVar3);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::sequenceRange(local_28);
  pSVar6 = ShapeConstraint::sequenceRange(outputShape);
  ShapeRange::intersect(&local_48,pSVar5,pSVar6);
  ShapeConstraint::updateSequenceRange(pmVar4,&local_48);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::batchRange(local_28);
  pSVar6 = ShapeConstraint::batchRange(outputShape);
  ShapeRange::intersect((ShapeRange *)&reduce.axis_,pSVar5,pSVar6);
  ShapeConstraint::updateBatchRange(pmVar4,(ShapeRange *)&reduce.axis_);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::sequenceRange(local_28);
  ShapeConstraint::updateSequenceRange(pSVar1,pSVar5);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::batchRange(local_28);
  ShapeConstraint::updateBatchRange(pSVar1,pSVar5);
  from = Specification::NeuralNetworkLayer::reduce((NeuralNetworkLayer *)inputShape);
  Specification::ReduceLayerParams::ReduceLayerParams((ReduceLayerParams *)local_88,from);
  RVar2 = Specification::ReduceLayerParams::axis((ReduceLayerParams *)local_88);
  pmVar4 = local_28;
  if (RVar2 == ReduceLayerParams_ReduceAxis_CHW) {
    ShapeConstraint::setChannel(local_28,1);
    ShapeConstraint::setHeight(local_28,1);
    ShapeConstraint::setWidth(local_28,1);
  }
  else if (RVar2 == ReduceLayerParams_ReduceAxis_HW) {
    pSVar5 = ShapeConstraint::channelRange(local_28);
    pSVar6 = ShapeConstraint::channelRange(outputShape);
    ShapeRange::intersect(&local_b8,pSVar5,pSVar6);
    ShapeConstraint::updateChannelRange(pmVar4,&local_b8);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::channelRange(local_28);
    ShapeConstraint::updateChannelRange(pSVar1,pSVar5);
    ShapeConstraint::setHeight(local_28,1);
    ShapeConstraint::setWidth(local_28,1);
  }
  else if (RVar2 == ReduceLayerParams_ReduceAxis_C) {
    ShapeConstraint::setChannel(local_28,1);
    pmVar4 = local_28;
    pSVar5 = ShapeConstraint::heightRange(local_28);
    pSVar6 = ShapeConstraint::heightRange(outputShape);
    ShapeRange::intersect(&local_158,pSVar5,pSVar6);
    ShapeConstraint::updateHeightRange(pmVar4,&local_158);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::heightRange(local_28);
    ShapeConstraint::updateHeightRange(pSVar1,pSVar5);
    pmVar4 = local_28;
    pSVar5 = ShapeConstraint::widthRange(local_28);
    pSVar6 = ShapeConstraint::widthRange(outputShape);
    ShapeRange::intersect(&local_178,pSVar5,pSVar6);
    ShapeConstraint::updateWidthRange(pmVar4,&local_178);
    pmVar4 = local_28;
    pSVar5 = ShapeConstraint::widthRange(local_28);
    ShapeConstraint::updateWidthRange(pmVar4,pSVar5);
  }
  else if (RVar2 == ReduceLayerParams_ReduceAxis_H) {
    pSVar5 = ShapeConstraint::channelRange(local_28);
    pSVar6 = ShapeConstraint::channelRange(outputShape);
    ShapeRange::intersect(&local_d8,pSVar5,pSVar6);
    ShapeConstraint::updateChannelRange(pmVar4,&local_d8);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::channelRange(local_28);
    ShapeConstraint::updateChannelRange(pSVar1,pSVar5);
    ShapeConstraint::setHeight(local_28,1);
    pmVar4 = local_28;
    pSVar5 = ShapeConstraint::widthRange(local_28);
    pSVar6 = ShapeConstraint::widthRange(outputShape);
    ShapeRange::intersect(&local_f8,pSVar5,pSVar6);
    ShapeConstraint::updateWidthRange(pmVar4,&local_f8);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::widthRange(local_28);
    ShapeConstraint::updateWidthRange(pSVar1,pSVar5);
  }
  else if (RVar2 == ReduceLayerParams_ReduceAxis_W) {
    pSVar5 = ShapeConstraint::channelRange(local_28);
    pSVar6 = ShapeConstraint::channelRange(outputShape);
    ShapeRange::intersect(&local_118,pSVar5,pSVar6);
    ShapeConstraint::updateChannelRange(pmVar4,&local_118);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::channelRange(local_28);
    ShapeConstraint::updateChannelRange(pSVar1,pSVar5);
    pmVar4 = local_28;
    pSVar5 = ShapeConstraint::heightRange(local_28);
    pSVar6 = ShapeConstraint::heightRange(outputShape);
    ShapeRange::intersect(&local_138,pSVar5,pSVar6);
    ShapeConstraint::updateHeightRange(pmVar4,&local_138);
    pSVar1 = outputShape;
    pSVar5 = ShapeConstraint::heightRange(local_28);
    ShapeConstraint::updateHeightRange(pSVar1,pSVar5);
    ShapeConstraint::setWidth(local_28,1);
  }
  else if (RVar2 == 
           ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Reduce layer axis not set -- should have been caught in validator.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Specification::ReduceLayerParams::~ReduceLayerParams((ReduceLayerParams *)local_88);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReduceLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reduce layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reduce layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::ReduceLayerParams reduce = specLayer.reduce();

    switch (reduce.axis()) {
        case Specification::ReduceLayerParams::CHW: {
            outputShape.setChannel(1);
            outputShape.setHeight(1);
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::HW: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.setHeight(1);
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::H: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.setHeight(1);
            outputShape.updateWidthRange(outputShape.widthRange().intersect(inputShape.widthRange()));
            inputShape.updateWidthRange(outputShape.widthRange());
            break;
        }
        case Specification::ReduceLayerParams::W: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.updateHeightRange(outputShape.heightRange().intersect(inputShape.heightRange()));
            inputShape.updateHeightRange(outputShape.heightRange());
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::C: {
            outputShape.setChannel(1);
            outputShape.updateHeightRange(outputShape.heightRange().intersect(inputShape.heightRange()));
            inputShape.updateHeightRange(outputShape.heightRange());
            outputShape.updateWidthRange(outputShape.widthRange().intersect(inputShape.widthRange()));
            outputShape.updateWidthRange(outputShape.widthRange());
            break;
        }
        case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
        case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_: {
            throw std::runtime_error("Reduce layer axis not set -- should have been caught in validator.");
            break;
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reduce layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reduce layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}